

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmBreak(LlvmCompilationContext *ctx,ExprBreak *node)

{
  uint uVar1;
  LoopInfo *pLVar2;
  LLVMBasicBlockRef pLVar3;
  LLVMValueRef pLVar4;
  LLVMBasicBlockRef afterReturn;
  LLVMBasicBlockRef target;
  ExprBreak *node_local;
  LlvmCompilationContext *ctx_local;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  uVar1 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::size(&ctx->loopInfo);
  pLVar2 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::operator[]
                     (&ctx->loopInfo,uVar1 - *(int *)&(node->super_ExprBase).field_0x2c);
  LLVMBuildBr(ctx->builder,pLVar2->breakBlock);
  pLVar3 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"after_break");
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar3);
  pLVar4 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar4;
}

Assistant:

LLVMValueRef CompileLlvmBreak(LlvmCompilationContext &ctx, ExprBreak *node)
{
	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef target = ctx.loopInfo[ctx.loopInfo.size() - node->depth].breakBlock;

	LLVMBuildBr(ctx.builder, target);

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_break");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}